

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstdarg_test.cpp
# Opt level: O0

void variadic_function_copy_all(pint unused,__va_list_tag *ap)

{
  uint uVar1;
  undefined4 *local_338;
  uint *local_320;
  undefined4 *local_308;
  uint *local_2f0;
  int *local_2d8;
  puint32 *local_2c0;
  long *local_2a8;
  puint64 *local_290;
  int *local_278;
  puint *local_260;
  undefined4 *local_248;
  long *local_230;
  undefined4 *local_218;
  long *local_200;
  double *local_1e8;
  double *local_1c8;
  double *local_1a8;
  double *local_188;
  undefined8 *local_168;
  undefined4 *local_150;
  long *local_138;
  undefined4 *local_120;
  puint *local_108;
  int *local_f0;
  puint64 *local_d8;
  long *local_c0;
  puint32 *local_a8;
  int *local_90;
  uint *local_78;
  undefined4 *local_60;
  uint *local_48;
  undefined4 *local_30;
  __va_list_tag *ap_local;
  pint unused_local;
  
  printf("** Debug: %s **\n","Unstacking a copy of all the arguments");
  printf("** Debug: %s **\n","Unstacking a pint8");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_30 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_30 = (undefined4 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_30 + 2;
  }
  if ((char)*local_30 != -0x80) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint8");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_48 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_48 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_48 + 2;
  }
  if ((*local_48 & 0xff) != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint16");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_60 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_60 = (undefined4 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_60 + 2;
  }
  if ((short)*local_60 != -0x8000) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint16");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_78 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_78 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_78 + 2;
  }
  if ((*local_78 & 0xffff) != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint32");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_90 = (int *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_90 = (int *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_90 + 2;
  }
  if (*local_90 != pint32_var[0]) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint32");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_a8 = (puint32 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_a8 = (puint32 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_a8 + 2;
  }
  if (*local_a8 != puint32_var[0]) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint64");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_c0 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_c0 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_c0 + 1;
  }
  if (*local_c0 != pint64_var[0]) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint64");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_d8 = (puint64 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_d8 = (puint64 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_d8 + 1;
  }
  if (*local_d8 != puint64_var[0]) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_f0 = (int *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_f0 = (int *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_f0 + 2;
  }
  if (*local_f0 != -0x80000000) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_108 = (puint *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_108 = (puint *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_108 + 2;
  }
  if (*local_108 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pshort");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_120 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_120 = (undefined4 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_120 + 2;
  }
  if ((short)*local_120 != -0x8000) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a plong");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_138 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_138 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_138 + 1;
  }
  if (*local_138 != -0x8000000000000000) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pchar");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_150 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_150 = (undefined4 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_150 + 2;
  }
  if ((char)*local_150 != '\0') {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a ppointer");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_168 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_168 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_168 + 1;
  }
  if ((ppointer)*local_168 != (ppointer)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pfloat");
  uVar1 = ap->fp_offset;
  if (uVar1 < 0xa1) {
    local_188 = (double *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->fp_offset = uVar1 + 0x10;
  }
  else {
    local_188 = (double *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_188 + 1;
  }
  if (((float)*local_188 != -1.234) || (NAN((float)*local_188))) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pdouble");
  uVar1 = ap->fp_offset;
  if (uVar1 < 0xa1) {
    local_1a8 = (double *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->fp_offset = uVar1 + 0x10;
  }
  else {
    local_1a8 = (double *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_1a8 + 1;
  }
  if ((*local_1a8 != -1.567) || (NAN(*local_1a8))) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pdouble");
  uVar1 = ap->fp_offset;
  if (uVar1 < 0xa1) {
    local_1c8 = (double *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->fp_offset = uVar1 + 0x10;
  }
  else {
    local_1c8 = (double *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_1c8 + 1;
  }
  if ((*local_1c8 != 1.567) || (NAN(*local_1c8))) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pfloat");
  uVar1 = ap->fp_offset;
  if (uVar1 < 0xa1) {
    local_1e8 = (double *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->fp_offset = uVar1 + 0x10;
  }
  else {
    local_1e8 = (double *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_1e8 + 1;
  }
  if (((float)*local_1e8 != 1.234) || (NAN((float)*local_1e8))) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a ppointer");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_200 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_200 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_200 + 1;
  }
  if ((code *)*local_200 != p_libsys_init) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pchar");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_218 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_218 = (undefined4 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_218 + 2;
  }
  if ((char)*local_218 != 'z') {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a plong");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_230 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_230 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_230 + 1;
  }
  if (*local_230 != 0x7fffffffffffffff) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pshort");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_248 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_248 = (undefined4 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_248 + 2;
  }
  if ((short)*local_248 != 0x7fff) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_260 = (puint *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_260 = (puint *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_260 + 2;
  }
  if (*local_260 != 0xffffffff) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_278 = (int *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_278 = (int *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_278 + 2;
  }
  if (*local_278 != 0x7fffffff) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint64");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_290 = (puint64 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_290 = (puint64 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_290 + 1;
  }
  if (*local_290 != puint64_var[1]) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint64");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_2a8 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_2a8 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_2a8 + 1;
  }
  if (*local_2a8 != pint64_var[1]) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint32");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_2c0 = (puint32 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_2c0 = (puint32 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_2c0 + 2;
  }
  if (*local_2c0 != puint32_var[1]) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint32");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_2d8 = (int *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_2d8 = (int *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_2d8 + 2;
  }
  if (*local_2d8 != pint32_var[1]) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint16");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_2f0 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_2f0 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_2f0 + 2;
  }
  if ((*local_2f0 & 0xffff) != 0xffff) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint16");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_308 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_308 = (undefined4 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_308 + 2;
  }
  if ((short)*local_308 != 0x7fff) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a puint8");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_320 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_320 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_320 + 2;
  }
  if ((*local_320 & 0xff) != 0xff) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  printf("** Debug: %s **\n","Unstacking a pint8");
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_338 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_338 = (undefined4 *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_338 + 2;
  }
  if ((char)*local_338 != '\x7f') {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pstdarg_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  return;
}

Assistant:

static void variadic_function_copy_all (pint unused, p_va_list ap)
{
	P_UNUSED (unused);
	P_DEBUG ("Unstacking a copy of all the arguments");
	P_TEST_VA_ARG_HEAD (ap);
	P_TEST_VA_ARG_TRAIL (ap);
}